

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O0

golf_transform_t *
golf_transform_apply_movement
          (golf_transform_t *__return_storage_ptr__,golf_transform_t transform,
          golf_movement_t movement,float t)

{
  golf_transform_t gVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  quat qVar7;
  vec3 vVar8;
  golf_transform_t *new_transform;
  quat r_2;
  float a_3;
  float a_2;
  float s4;
  float s3;
  float s2;
  float s1;
  float theta_1;
  vec3 axis;
  float transition_length;
  float theta1;
  float theta0;
  quat r_1;
  float theta;
  float a_1;
  quat r;
  float a;
  undefined8 local_34;
  vec3 p;
  vec3 p1;
  vec3 p0;
  float l;
  float t_local;
  
  gVar1 = transform;
  fVar2 = fmodf(movement.t0 + t,movement.length);
  (__return_storage_ptr__->scale).y = transform.scale.y;
  (__return_storage_ptr__->scale).z = transform.scale.z;
  transform.position._0_8_ = gVar1.position._0_8_;
  transform._8_8_ = gVar1._8_8_;
  transform.rotation._4_8_ = gVar1.rotation._4_8_;
  transform._24_8_ = gVar1._24_8_;
  (__return_storage_ptr__->rotation).y = transform.rotation.y;
  (__return_storage_ptr__->rotation).z = transform.rotation.z;
  *(undefined8 *)&(__return_storage_ptr__->rotation).w = transform._24_8_;
  (__return_storage_ptr__->position).x = transform.position.x;
  (__return_storage_ptr__->position).y = transform.position.y;
  *(undefined8 *)&(__return_storage_ptr__->position).z = transform._8_8_;
  transform.rotation = gVar1.rotation;
  switch(movement._0_8_ & 0xffffffff) {
  case 0:
    break;
  case 1:
    transform.position = gVar1.position;
    if (movement.length * 0.5 <= fVar2) {
      vVar8 = vec3_interpolate(movement.field_4.linear.p0,movement.field_4.linear.p1,
                               (movement.length - fVar2) / (movement.length * 0.5));
      vVar8 = vec3_add(transform.position,vVar8);
      p.x = vVar8.z;
      local_34 = vVar8._0_8_;
    }
    else {
      vVar8 = vec3_interpolate(movement.field_4.linear.p0,movement.field_4.linear.p1,
                               fVar2 / (movement.length * 0.5));
      vVar8 = vec3_add(transform.position,vVar8);
      p.x = vVar8.z;
      local_34 = vVar8._0_8_;
    }
    (__return_storage_ptr__->position).x = (float)(undefined4)local_34;
    (__return_storage_ptr__->position).y = (float)local_34._4_4_;
    (__return_storage_ptr__->position).z = p.x;
    break;
  case 2:
    vVar8 = vec3_create(0.0,1.0,0.0);
    qVar7 = quat_create_from_axis_angle(vVar8,(fVar2 / movement.length) * 6.2831855);
    qVar7 = quat_multiply(qVar7,transform.rotation);
    (__return_storage_ptr__->rotation).x = (float)(int)qVar7._0_8_;
    (__return_storage_ptr__->rotation).y = (float)(int)((ulong)qVar7._0_8_ >> 0x20);
    (__return_storage_ptr__->rotation).z = (float)(int)qVar7._8_8_;
    (__return_storage_ptr__->rotation).w = (float)(int)((ulong)qVar7._8_8_ >> 0x20);
    break;
  case 3:
    r_1.w = (fVar2 / movement.length) * 2.0;
    if (1.0 <= r_1.w) {
      r_1.w = 2.0 - r_1.w;
    }
    fVar2 = cosf(r_1.w * 3.1415927);
    qVar7 = quat_create_from_axis_angle
                      (movement.field_4.pendulum.axis,movement.field_4.linear.p0.x * fVar2);
    qVar7 = quat_multiply(qVar7,transform.rotation);
    (__return_storage_ptr__->rotation).x = (float)(int)qVar7._0_8_;
    (__return_storage_ptr__->rotation).y = (float)(int)((ulong)qVar7._0_8_ >> 0x20);
    (__return_storage_ptr__->rotation).z = (float)(int)qVar7._8_8_;
    (__return_storage_ptr__->rotation).w = (float)(int)((ulong)qVar7._8_8_ >> 0x20);
    break;
  case 4:
    fVar3 = (movement.field_4.linear.p0.x / 360.0) * 6.2831855;
    fVar4 = (movement.field_4.linear.p0.y / 360.0) * 6.2831855;
    fVar5 = movement.length * 0.5 + -movement.field_4.linear.p0.z;
    fVar6 = movement.length * 0.5 + movement.field_4.linear.p0.z;
    s2 = fVar3;
    if (movement.field_4.linear.p0.z <= fVar2) {
      if (fVar5 <= fVar2) {
        s2 = fVar4;
        if ((fVar6 <= fVar2) && (s2 = fVar3, fVar2 < movement.length - movement.field_4.linear.p0.z)
           ) {
          s2 = ((fVar2 - fVar6) / ((movement.length - movement.field_4.linear.p0.z) - fVar6)) *
               (fVar3 - fVar4) + fVar4;
        }
      }
      else {
        s2 = ((fVar2 - movement.field_4.linear.p0.z) / (fVar5 - movement.field_4.linear.p0.z)) *
             (fVar4 - fVar3) + fVar3;
      }
    }
    qVar7 = quat_create_from_axis_angle(movement.field_4.linear.p1,s2);
    qVar7 = quat_multiply(qVar7,transform.rotation);
    (__return_storage_ptr__->rotation).x = (float)(int)qVar7._0_8_;
    (__return_storage_ptr__->rotation).y = (float)(int)((ulong)qVar7._0_8_ >> 0x20);
    (__return_storage_ptr__->rotation).z = (float)(int)qVar7._8_8_;
    (__return_storage_ptr__->rotation).w = (float)(int)((ulong)qVar7._8_8_ >> 0x20);
  }
  return __return_storage_ptr__;
}

Assistant:

golf_transform_t golf_transform_apply_movement(golf_transform_t transform, golf_movement_t movement, float t) {
    float l = movement.length;
    t = fmodf(movement.t0 + t, l);
    golf_transform_t new_transform = transform;
    switch (movement.type) {
        case GOLF_MOVEMENT_NONE:
            break;
        case GOLF_MOVEMENT_LINEAR: {
            vec3 p0 = movement.linear.p0;
            vec3 p1 = movement.linear.p1;
            vec3 p = transform.position;
            if (t < 0.5f * l) {
                p = vec3_add(p, vec3_interpolate(p0, p1, t / (0.5f * l)));
            }
            else {
                p = vec3_add(p, vec3_interpolate(p0, p1, (l - t) / (0.5f * l)));
            }
            new_transform.position = p;
            break;
        }
        case GOLF_MOVEMENT_SPINNER: {
            float a = 2 * MF_PI * (t / l);
            quat r = quat_create_from_axis_angle(V3(0, 1, 0), a);
            new_transform.rotation = quat_multiply(r, transform.rotation);
            break;
        }
        case GOLF_MOVEMENT_PENDULUM: {
            float a = 2 * (t / l);
            if (a >= 1) a = 2 - a;

            float theta = movement.pendulum.theta0 * cosf(MF_PI * a);
            quat r = quat_create_from_axis_angle(movement.pendulum.axis, theta);
            new_transform.rotation = quat_multiply(r, transform.rotation);
            break;
        }
        case GOLF_MOVEMENT_RAMP: {
            float theta0 = 2.0f * MF_PI * (movement.ramp.theta0 / 360.0f);
            float theta1 = 2.0f * MF_PI * (movement.ramp.theta1 / 360.0f);
            float transition_length = movement.ramp.transition_length;
            vec3 axis = movement.ramp.axis;
            float theta = 0;

            float s1 = transition_length;
            float s2 = 0.5f * l - transition_length;
            float s3 = 0.5f * l + transition_length;
            float s4 = l - transition_length;

            // stuck at bottom
            if (t < s1) {
                theta = theta0;
            }
            // going up
            else if (t < s2) {
                float a = (t - s1) / (s2 - s1);
                theta = theta0 + a * (theta1 - theta0);
            }
            // stuck at top
            else if (t < s3) {
                theta = theta1;
            }
            // going down
            else if (t < s4) {
                float a = (t - s3) / (s4 - s3);
                theta = theta1 + a * (theta0 - theta1);
            }
            // stuck at bottom
            else {
                theta = theta0;
            }

            quat r = quat_create_from_axis_angle(axis, theta);
            new_transform.rotation = quat_multiply(r, transform.rotation);

            break;
        }
    }
    return new_transform;
}